

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

void __thiscall
QComboBoxPrivate::initViewItemOption(QComboBoxPrivate *this,QStyleOptionViewItem *option)

{
  QWidget *this_00;
  QArrayData *pQVar1;
  char16_t *pcVar2;
  QAbstractItemModel *pQVar3;
  undefined1 auVar4 [8];
  QComboBoxPrivateContainer *pQVar5;
  long in_FS_OFFSET;
  undefined1 local_60 [8];
  QModelIndex local_58;
  QIcon local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  pQVar5 = viewContainer(*(QComboBoxPrivate **)&this_00->field_0x8);
  (**(code **)(*(long *)&(pQVar5->view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
              0x2f8))(pQVar5->view,option);
  option->widget = this_00;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&this->currentIndex);
  (option->index).m.ptr = local_58.m.ptr;
  (option->index).r = local_58.r;
  (option->index).c = local_58.c;
  (option->index).i = local_58.i;
  QComboBox::currentText((QString *)&local_58,(QComboBox *)this_00);
  pQVar1 = &((option->text).d.d)->super_QArrayData;
  pcVar2 = (option->text).d.ptr;
  (option->text).d.d = (Data *)local_58._0_8_;
  (option->text).d.ptr = (char16_t *)local_58.i;
  pQVar3 = (QAbstractItemModel *)(option->text).d.size;
  (option->text).d.size = (qsizetype)local_58.m.ptr;
  local_58._0_8_ = pQVar1;
  local_58.i = (quintptr)pcVar2;
  local_58.m.ptr = pQVar3;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,&this->currentIndex);
  itemIcon((QComboBoxPrivate *)local_60,(QModelIndex *)this);
  auVar4 = local_60;
  local_60 = (undefined1  [8])0x0;
  local_38.d = (option->icon).d;
  (option->icon).d = (QIconPrivate *)auVar4;
  QIcon::~QIcon(&local_38);
  QIcon::~QIcon((QIcon *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::initViewItemOption(QStyleOptionViewItem *option) const
{
    Q_Q(const QComboBox);
    q->view()->initViewItemOption(option);
    option->widget = q;
    option->index = currentIndex;
    option->text = q->currentText();
    option->icon = itemIcon(currentIndex);
}